

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEException.cpp
# Opt level: O0

void __thiscall
CEExceptionHandler::CEExceptionHandler
          (CEExceptionHandler *this,string *origin,string *message,string *type)

{
  string *in_RCX;
  string *in_RDX;
  string *in_RSI;
  long in_RDI;
  CEExceptionHandler *in_stack_00000390;
  
  CEExceptionHandler(in_stack_00000390);
  std::__cxx11::string::operator=((string *)(in_RDI + 8),in_RSI);
  std::__cxx11::string::operator+=((string *)(in_RDI + 0x48),in_RDX);
  std::__cxx11::string::operator=((string *)(in_RDI + 0x28),in_RCX);
  return;
}

Assistant:

CEExceptionHandler::CEExceptionHandler(const std::string& origin,
                                       const std::string& message,
                                       const std::string& type) :
    CEExceptionHandler()
{
    origin_  = origin;
    message_ += message;
    type_    = type;
}